

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O3

void setAnnealingPermute(void)

{
  bool bVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  uint p1;
  uint p2;
  ulong uVar6;
  int iVar7;
  double dVar8;
  double local_38;
  
  uperm2 = unpermute;
  perm2 = permute;
  uVar6 = (ulong)(uint)numOfVariables;
  if (0 < numOfVariables) {
    lVar5 = 1;
    do {
      perm2[lVar5] = (int)lVar5;
      uperm2[lVar5] = (int)lVar5;
      uVar6 = (ulong)numOfVariables;
      bVar1 = lVar5 < (long)uVar6;
      lVar5 = lVar5 + 1;
    } while (bVar1);
  }
  local_38 = 20.0;
  uperm1 = idpermute;
  perm1 = idpermute;
  do {
    if (0 < (int)uVar6) {
      iVar7 = 0;
      do {
        lVar5 = next * 0x41c64e6d + 0x3039;
        next = lVar5 * 0x41c64e6d + 0x3039;
        p1 = (int)((long)(ulong)((uint)((ulong)lVar5 >> 0x10) & 0x7fff) % (long)(int)uVar6) + 1;
        p2 = (int)((long)(ulong)((uint)(next >> 0x10) & 0x7fff) % (long)(int)uVar6) + 1;
        dVar8 = swapGain(p1,p2);
        iVar4 = beatProbability(dVar8 / local_38);
        piVar2 = permute;
        if (iVar4 != 0) {
          iVar4 = permute[p1];
          permute[p1] = permute[p2];
          piVar2[p2] = iVar4;
          piVar3 = unpermute;
          unpermute[piVar2[p1]] = p1;
          piVar3[piVar2[p2]] = p2;
        }
        uVar6 = (ulong)(uint)numOfVariables;
        iVar7 = iVar7 + 1;
      } while (SBORROW4(iVar7,numOfVariables * 4) != iVar7 + numOfVariables * -4 < 0);
    }
    local_38 = local_38 * 0.997;
  } while (0.2 < local_38);
  return;
}

Assistant:

void setAnnealingPermute ()
{
    int i, p1, p2, t;
    double temperature;
    double gain;

    for (i=1;i<=numOfVariables;i++)
    {
        permute[i] = i;
        unpermute[i] = i;
    }
    uperm1 = idpermute;
    perm1 = idpermute;
    perm2 = permute;
    uperm2 = unpermute;

    temperature = 20;

    while (temperature > 0.2)
    {
        for (i=1;i<=4*numOfVariables;i++)
        {
            p1 = 1 + myrand() % numOfVariables;
            p2 = 1 + myrand() % numOfVariables;
            gain = swapGain (p1, p2);
            if (beatProbability (gain/temperature))
            {
                t = permute[p1];
                permute[p1] = permute[p2];
                permute[p2] = t;
                unpermute[permute[p1]] = p1;
                unpermute[permute[p2]] = p2;

            }
       }
        temperature *= 0.997;
     }

}